

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  BYTE *pBVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  uint uVar7;
  BYTE *pBVar8;
  ZSTD_matchState_t *pZVar9;
  BYTE *pBVar10;
  U32 *pUVar11;
  U32 *pUVar12;
  ulong *mEnd;
  U32 *pUVar13;
  U32 *pUVar14;
  bool bVar15;
  uint uVar16;
  undefined8 uVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  ulong *puVar22;
  size_t sVar23;
  int *piVar24;
  byte bVar25;
  byte bVar26;
  U32 UVar27;
  int *piVar28;
  ulong *puVar29;
  uint uVar30;
  int iVar31;
  int *iStart;
  long lVar32;
  ulong *puVar33;
  long lVar34;
  BYTE *pBVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  ulong *puVar46;
  ulong *puVar47;
  U32 UVar48;
  ulong *puVar50;
  ulong *puVar51;
  ulong uVar52;
  seqDef *psVar53;
  BYTE *iend;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  BYTE *dictEnd;
  BYTE *base;
  BYTE *dictBase;
  U32 dictIndexDelta;
  U32 *hashLong;
  BYTE *ilimit;
  BYTE *dictStart;
  U32 dictStartIndex;
  U32 *hashSmall;
  U32 *dictHashLong;
  U32 *dictHashSmall;
  uint local_13c;
  ulong uVar45;
  int iVar49;
  
  pBVar8 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  iVar31 = (int)pBVar8;
  uVar37 = (int)iEnd - iVar31;
  uVar40 = (ms->window).dictLimit;
  uVar42 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar16 = uVar37 - uVar42;
  if (uVar37 - uVar40 <= uVar42) {
    uVar16 = uVar40;
  }
  pZVar9 = ms->dictMatchState;
  uVar7 = (pZVar9->window).dictLimit;
  pBVar10 = (pZVar9->window).base;
  piVar28 = (int *)(pBVar10 + uVar7);
  iStart = (int *)(pBVar8 + uVar16);
  uVar42 = uVar42 + uVar40;
  uVar40 = (ms->cParams).minMatch;
  pUVar11 = ms->hashTable;
  pUVar12 = ms->chainTable;
  puVar5 = (ulong *)((long)src + (srcSize - 8));
  mEnd = (ulong *)(pZVar9->window).nextSrc;
  uVar44 = ((int)pBVar10 - (int)mEnd) + uVar16;
  uVar45 = (ulong)uVar44;
  pUVar13 = pZVar9->hashTable;
  pUVar14 = pZVar9->chainTable;
  uVar39 = ((int)src - ((int)piVar28 + (int)iStart)) + (int)mEnd;
  uVar43 = *rep;
  uVar30 = rep[1];
  cVar18 = (char)(ms->cParams).hashLog;
  cVar19 = (char)(ms->cParams).chainLog;
  cVar20 = (char)(pZVar9->cParams).hashLog;
  cVar21 = (char)(pZVar9->cParams).chainLog;
  local_13c = uVar43;
  if (uVar40 == 5) {
    if (uVar42 < uVar37) goto LAB_001447f6;
    if (uVar39 < uVar43) goto LAB_00144815;
    puVar50 = (ulong *)((long)src + (ulong)(uVar39 == 0));
    if (uVar39 < uVar30) goto LAB_00144834;
    if (puVar50 < puVar5) {
      bVar25 = 0x40 - cVar18;
      bVar26 = 0x40 - cVar19;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar22 = iEnd + -4;
      do {
        uVar52 = *puVar50;
        uVar38 = uVar52 * -0x30e44323485a9b9d >> (bVar25 & 0x3f);
        uVar41 = uVar52 * -0x30e4432345000000 >> (bVar26 & 0x3f);
        iVar49 = (int)puVar50;
        UVar48 = iVar49 - iVar31;
        uVar40 = pUVar11[uVar38];
        uVar36 = (ulong)uVar40;
        UVar27 = UVar48 + 1;
        uVar37 = UVar27 - local_13c;
        piVar24 = (int *)(pBVar8 + uVar37);
        if (uVar37 < uVar16) {
          piVar24 = (int *)(pBVar10 + (uVar37 - uVar44));
        }
        uVar42 = pUVar12[uVar41];
        pUVar12[uVar41] = UVar48;
        pUVar11[uVar38] = UVar48;
        uVar43 = local_13c;
        if ((uVar37 - uVar16 < 0xfffffffd) && (*piVar24 == *(int *)((long)puVar50 + 1))) {
          puVar51 = iEnd;
          if (uVar37 < uVar16) {
            puVar51 = mEnd;
          }
          sVar23 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar50 + 5),(BYTE *)(piVar24 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar51,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0014471d;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001446fe;
          puVar51 = (ulong *)((long)puVar50 + 1);
          uVar52 = (long)puVar51 - (long)src;
          puVar50 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar50 + uVar52))
          goto LAB_001446c0;
          if (iEnd < puVar51) goto LAB_001446df;
          if (puVar22 < puVar51) {
            ZSTD_safecopyLiterals((BYTE *)puVar50,(BYTE *)src,(BYTE *)puVar51,(BYTE *)puVar22);
LAB_00142d7c:
            seqStore->lit = seqStore->lit + uVar52;
            if (0xffff < uVar52) {
              if (seqStore->longLengthID != 0) goto LAB_0014477a;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar36 = *(ulong *)((long)src + 8);
            *puVar50 = *src;
            puVar50[1] = uVar36;
            pBVar35 = seqStore->lit;
            if (0x10 < uVar52) {
              lVar32 = (long)(pBVar35 + 0x10) - ((long)src + 0x10);
              if (lVar32 < 8) {
                if (-0x10 < lVar32) goto LAB_00144799;
              }
              else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_001447b8;
              uVar36 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar35 + 0x18) = uVar36;
              if (0x20 < (long)uVar52) {
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)src + lVar32 + 0x20);
                  uVar17 = puVar6[1];
                  pBVar4 = pBVar35 + lVar32 + 0x20;
                  *(undefined8 *)pBVar4 = *puVar6;
                  *(undefined8 *)(pBVar4 + 8) = uVar17;
                  puVar6 = (undefined8 *)((long)src + lVar32 + 0x30);
                  uVar17 = puVar6[1];
                  *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                  *(undefined8 *)(pBVar4 + 0x18) = uVar17;
                  lVar32 = lVar32 + 0x20;
                } while (pBVar4 + 0x20 < pBVar35 + uVar52);
              }
              goto LAB_00142d7c;
            }
            seqStore->lit = pBVar35 + uVar52;
          }
          lVar32 = sVar23 + 4;
          uVar36 = sVar23 + 1;
          psVar53 = seqStore->sequences;
          psVar53->litLength = (U16)uVar52;
          psVar53->offset = 1;
          if (0xffff < uVar36) {
            if (seqStore->longLengthID != 0) goto LAB_0014473c;
LAB_00143641:
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar53 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_00143662:
          src = (void *)(lVar32 + (long)puVar51);
          psVar53->matchLength = (U16)uVar36;
          psVar53 = psVar53 + 1;
          seqStore->sequences = psVar53;
          puVar50 = (ulong *)src;
          if (src <= puVar5) {
            uVar40 = UVar48 + 2;
            lVar32 = *(long *)(pBVar8 + uVar40);
            pUVar11[(ulong)(lVar32 * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] = uVar40;
            pUVar11[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] =
                 ((int)src + -2) - iVar31;
            pUVar12[(ulong)(lVar32 * -0x30e4432345000000) >> (bVar26 & 0x3f)] = uVar40;
            pUVar12[(ulong)(*(long *)((long)src + -1) * -0x30e4432345000000) >> (bVar26 & 0x3f)] =
                 ((int)src + -1) - iVar31;
            uVar40 = uVar30;
            do {
              uVar42 = uVar43;
              UVar27 = (int)src - iVar31;
              uVar37 = UVar27 - uVar40;
              pBVar35 = pBVar8;
              if (uVar37 < uVar16) {
                pBVar35 = pBVar10 + -uVar45;
              }
              puVar50 = (ulong *)src;
              uVar30 = uVar40;
              uVar43 = uVar42;
              if ((0xfffffffc < uVar37 - uVar16) || (*(int *)(pBVar35 + uVar37) != (int)*src))
              break;
              puVar50 = iEnd;
              if (uVar37 < uVar16) {
                puVar50 = mEnd;
              }
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar35 + uVar37) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar50,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar53 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_0014471d;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001446fe;
              puVar50 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar50) goto LAB_001446c0;
              if (iEnd < src) goto LAB_001446df;
              if (puVar22 < src) {
                ZSTD_safecopyLiterals((BYTE *)puVar50,(BYTE *)src,(BYTE *)src,(BYTE *)puVar22);
              }
              else {
                uVar52 = *(ulong *)((long)src + 8);
                *puVar50 = *src;
                puVar50[1] = uVar52;
              }
              psVar53 = seqStore->sequences;
              psVar53->litLength = 0;
              psVar53->offset = 1;
              if (0xffff < sVar23 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_0014473c;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar53 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar53->matchLength = (U16)(sVar23 + 1);
              psVar53 = psVar53 + 1;
              seqStore->sequences = psVar53;
              uVar52 = *src;
              pUVar12[uVar52 * -0x30e4432345000000 >> (bVar26 & 0x3f)] = UVar27;
              pUVar11[uVar52 * -0x30e44323485a9b9d >> (bVar25 & 0x3f)] = UVar27;
              src = (void *)((long)src + sVar23 + 4);
              puVar50 = (ulong *)src;
              uVar30 = uVar42;
              uVar43 = uVar40;
              uVar40 = uVar42;
            } while (src <= puVar5);
          }
        }
        else {
          puVar51 = puVar50;
          if (uVar40 <= uVar16) {
            uVar40 = pUVar13[uVar52 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
            puVar29 = (ulong *)(pBVar10 + uVar40);
            if (puVar29 < mEnd) {
              if ((uVar40 <= uVar7) || (*puVar29 != uVar52)) goto LAB_00142f26;
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)(puVar50 + 1),(BYTE *)(puVar29 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              lVar32 = sVar23 + 8;
              uVar43 = UVar48 - (uVar44 + uVar40);
              if (src < puVar50) {
                piVar24 = (int *)(pBVar10 + ((ulong)uVar40 - 1));
                puVar51 = (ulong *)((long)puVar50 + -1);
                do {
                  if ((char)*puVar51 != (char)*piVar24) goto LAB_00143148;
                  lVar32 = lVar32 + 1;
                  puVar50 = (ulong *)((long)puVar51 + -1);
                } while ((piVar28 < piVar24) &&
                        (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar51,
                        puVar51 = puVar50, bVar15));
                goto LAB_00143485;
              }
              goto LAB_00143531;
            }
            goto LAB_0014475b;
          }
          puVar29 = (ulong *)(pBVar8 + uVar36);
          if (*puVar29 == uVar52) {
            puVar47 = puVar50 + 1;
            puVar33 = puVar29 + 1;
            puVar46 = puVar47;
            if (puVar47 < puVar1) {
              if (*puVar33 == *puVar47) {
                lVar32 = 0;
                do {
                  puVar33 = (ulong *)((long)puVar50 + lVar32 + 0x10);
                  if (puVar1 <= puVar33) {
                    puVar33 = (ulong *)(pBVar8 + lVar32 + uVar36 + 0x10);
                    puVar46 = (ulong *)((long)puVar50 + lVar32 + 0x10);
                    goto LAB_001432fc;
                  }
                  lVar34 = lVar32 + uVar36 + 0x10;
                  uVar52 = *puVar33;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar8 + lVar34) == uVar52);
                uVar52 = uVar52 ^ *(ulong *)(pBVar8 + lVar34);
                uVar38 = 0;
                if (uVar52 != 0) {
                  for (; (uVar52 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar52 = (uVar38 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar38 = *puVar47 ^ *puVar33;
                uVar52 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                  }
                }
                uVar52 = uVar52 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001432fc:
              if ((puVar46 < puVar2) && ((int)*puVar33 == (int)*puVar46)) {
                puVar46 = (ulong *)((long)puVar46 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar46 < puVar3) && ((short)*puVar33 == (short)*puVar46)) {
                puVar46 = (ulong *)((long)puVar46 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar46 < iEnd) {
                puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar46));
              }
              uVar52 = (long)puVar46 - (long)puVar47;
            }
            lVar32 = uVar52 + 8;
            uVar43 = iVar49 - (int)puVar29;
            if (puVar50 <= src) goto LAB_00143531;
            piVar24 = (int *)(pBVar8 + (uVar36 - 1));
            puVar51 = (ulong *)((long)puVar50 + -1);
            do {
              if ((char)*puVar51 != (char)*piVar24) goto LAB_00143526;
              lVar32 = lVar32 + 1;
              puVar50 = (ulong *)((long)puVar51 + -1);
            } while ((iStart < piVar24) &&
                    (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar51,
                    puVar51 = puVar50, bVar15));
            goto LAB_00143485;
          }
LAB_00142f26:
          if (uVar42 <= uVar16) {
            uVar42 = pUVar14[uVar52 * -0x30e4432345000000 >> (0x40U - cVar21 & 0x3f)];
            if ((uVar42 <= uVar7) || (*(int *)(pBVar10 + uVar42) != (int)*puVar50))
            goto LAB_0014302f;
            piVar24 = (int *)(pBVar10 + uVar42);
            uVar42 = uVar42 + uVar44;
LAB_00142f7e:
            uVar52 = *(ulong *)((long)puVar50 + 1);
            uVar38 = uVar52 * -0x30e44323485a9b9d >> (bVar25 & 0x3f);
            puVar51 = (ulong *)((long)puVar50 + 1);
            uVar40 = pUVar11[uVar38];
            uVar36 = (ulong)uVar40;
            pUVar11[uVar38] = UVar27;
            if (uVar16 < uVar40) {
              puVar29 = (ulong *)(pBVar8 + uVar36);
              if (*puVar29 == uVar52) {
                puVar47 = (ulong *)((long)puVar50 + 9);
                puVar33 = puVar29 + 1;
                puVar46 = puVar47;
                if (puVar47 < puVar1) {
                  if (*puVar33 == *puVar47) {
                    lVar32 = 0;
                    do {
                      puVar33 = (ulong *)((long)puVar50 + lVar32 + 0x11);
                      if (puVar1 <= puVar33) {
                        puVar33 = (ulong *)(pBVar8 + lVar32 + uVar36 + 0x10);
                        puVar46 = (ulong *)((long)puVar50 + lVar32 + 0x11);
                        goto LAB_00143498;
                      }
                      lVar34 = lVar32 + uVar36 + 0x10;
                      uVar52 = *puVar33;
                      lVar32 = lVar32 + 8;
                    } while (*(ulong *)(pBVar8 + lVar34) == uVar52);
                    uVar52 = uVar52 ^ *(ulong *)(pBVar8 + lVar34);
                    uVar38 = 0;
                    if (uVar52 != 0) {
                      for (; (uVar52 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar52 = (uVar38 >> 3 & 0x1fffffff) + lVar32;
                  }
                  else {
                    uVar38 = *puVar47 ^ *puVar33;
                    uVar52 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    uVar52 = uVar52 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00143498:
                  if ((puVar46 < puVar2) && ((int)*puVar33 == (int)*puVar46)) {
                    puVar46 = (ulong *)((long)puVar46 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar46 < puVar3) && ((short)*puVar33 == (short)*puVar46)) {
                    puVar46 = (ulong *)((long)puVar46 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar46 < iEnd) {
                    puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar46));
                  }
                  uVar52 = (long)puVar46 - (long)puVar47;
                }
                lVar32 = uVar52 + 8;
                uVar43 = (int)puVar51 - (int)puVar29;
                if (src < puVar51) {
                  piVar24 = (int *)(pBVar8 + (uVar36 - 1));
                  do {
                    if ((char)*puVar50 != (char)*piVar24) goto LAB_00143485;
                    lVar32 = lVar32 + 1;
                    puVar51 = (ulong *)((long)puVar50 + -1);
                  } while ((iStart < piVar24) &&
                          (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar50,
                          puVar50 = puVar51, bVar15));
LAB_00143526:
                  puVar51 = (ulong *)((long)puVar51 + 1);
                }
              }
              else {
LAB_00143153:
                puVar51 = (ulong *)((long)puVar50 + 4);
                puVar29 = (ulong *)(piVar24 + 1);
                if (uVar42 < uVar16) {
                  sVar23 = ZSTD_count_2segments
                                     ((BYTE *)puVar51,(BYTE *)puVar29,(BYTE *)iEnd,(BYTE *)mEnd,
                                      (BYTE *)iStart);
                  lVar32 = sVar23 + 4;
                  uVar43 = UVar48 - uVar42;
                  puVar51 = puVar50;
                  if ((piVar28 < piVar24) && (src < puVar50)) {
                    puVar51 = (ulong *)((long)puVar50 + -1);
                    do {
                      piVar24 = (int *)((long)piVar24 + -1);
                      if ((char)*puVar51 != *(char *)piVar24) goto LAB_00143148;
                      lVar32 = lVar32 + 1;
                      puVar50 = (ulong *)((long)puVar51 + -1);
                    } while ((piVar28 < piVar24) &&
                            (bVar15 = src < puVar51, puVar51 = puVar50, bVar15));
LAB_00143485:
                    puVar51 = (ulong *)((long)puVar50 + 1);
                  }
                }
                else {
                  puVar47 = puVar51;
                  if (puVar51 < puVar1) {
                    if (*puVar29 == *puVar51) {
                      lVar32 = 0;
                      do {
                        puVar29 = (ulong *)((long)puVar50 + lVar32 + 0xc);
                        if (puVar1 <= puVar29) {
                          puVar29 = (ulong *)((long)piVar24 + lVar32 + 0xc);
                          puVar47 = (ulong *)((long)puVar50 + lVar32 + 0xc);
                          goto LAB_001433ea;
                        }
                        uVar52 = *(ulong *)((long)piVar24 + lVar32 + 0xc);
                        uVar36 = *puVar29;
                        lVar32 = lVar32 + 8;
                      } while (uVar52 == uVar36);
                      uVar36 = uVar36 ^ uVar52;
                      uVar52 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                        }
                      }
                      uVar52 = (uVar52 >> 3 & 0x1fffffff) + lVar32;
                    }
                    else {
                      uVar36 = *puVar51 ^ *puVar29;
                      uVar52 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                        }
                      }
                      uVar52 = uVar52 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_001433ea:
                    if ((puVar47 < puVar2) && ((int)*puVar29 == (int)*puVar47)) {
                      puVar47 = (ulong *)((long)puVar47 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar47 < puVar3) && ((short)*puVar29 == (short)*puVar47)) {
                      puVar47 = (ulong *)((long)puVar47 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar47 < iEnd) {
                      puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar47))
                      ;
                    }
                    uVar52 = (long)puVar47 - (long)puVar51;
                  }
                  lVar32 = uVar52 + 4;
                  uVar43 = iVar49 - (int)piVar24;
                  puVar51 = puVar50;
                  if ((iStart < piVar24) && (src < puVar50)) {
                    puVar51 = (ulong *)((long)puVar50 + -1);
                    do {
                      piVar24 = (int *)((long)piVar24 + -1);
                      if ((char)*puVar51 != *(char *)piVar24) goto LAB_00143148;
                      lVar32 = lVar32 + 1;
                      puVar50 = (ulong *)((long)puVar51 + -1);
                    } while ((iStart < piVar24) &&
                            (bVar15 = src < puVar51, puVar51 = puVar50, bVar15));
                    goto LAB_00143485;
                  }
                }
              }
            }
            else {
              uVar40 = pUVar13[uVar52 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
              puVar29 = (ulong *)(pBVar10 + uVar40);
              if (mEnd <= puVar29) goto LAB_001447d7;
              if ((uVar40 <= uVar7) || (*puVar29 != uVar52)) goto LAB_00143153;
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar50 + 9),(BYTE *)(puVar29 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              lVar32 = sVar23 + 8;
              uVar43 = UVar27 - (uVar44 + uVar40);
              if (src < puVar51) {
                piVar24 = (int *)(pBVar10 + ((ulong)uVar40 - 1));
                do {
                  if ((char)*puVar50 != (char)*piVar24) goto LAB_00143485;
                  lVar32 = lVar32 + 1;
                  puVar51 = (ulong *)((long)puVar50 + -1);
                } while ((piVar28 < piVar24) &&
                        (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar50,
                        puVar50 = puVar51, bVar15));
LAB_00143148:
                puVar51 = (ulong *)((long)puVar51 + 1);
              }
            }
LAB_00143531:
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar52 = (long)puVar51 - (long)src;
                puVar50 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar50 + uVar52) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (puVar51 <= iEnd) {
                    if (puVar22 < puVar51) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar50,(BYTE *)src,(BYTE *)puVar51,(BYTE *)puVar22);
LAB_0014359a:
                      seqStore->lit = seqStore->lit + uVar52;
                      if (0xffff < uVar52) {
                        if (seqStore->longLengthID != 0) goto LAB_0014477a;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = *(ulong *)((long)src + 8);
                      *puVar50 = *src;
                      puVar50[1] = uVar36;
                      pBVar35 = seqStore->lit;
                      if (0x10 < uVar52) {
                        lVar34 = (long)(pBVar35 + 0x10) - ((long)src + 0x10);
                        if (lVar34 < 8) {
                          if (-0x10 < lVar34) goto LAB_00144799;
                        }
                        else if (0xffffffffffffffe0 < lVar34 - 0x10U) goto LAB_001447b8;
                        uVar36 = *(ulong *)((long)src + 0x18);
                        *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
                        *(ulong *)(pBVar35 + 0x18) = uVar36;
                        if (0x20 < (long)uVar52) {
                          lVar34 = 0;
                          do {
                            puVar6 = (undefined8 *)((long)src + lVar34 + 0x20);
                            uVar17 = puVar6[1];
                            pBVar4 = pBVar35 + lVar34 + 0x20;
                            *(undefined8 *)pBVar4 = *puVar6;
                            *(undefined8 *)(pBVar4 + 8) = uVar17;
                            puVar6 = (undefined8 *)((long)src + lVar34 + 0x30);
                            uVar17 = puVar6[1];
                            *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                            *(undefined8 *)(pBVar4 + 0x18) = uVar17;
                            lVar34 = lVar34 + 0x20;
                          } while (pBVar4 + 0x20 < pBVar35 + uVar52);
                        }
                        goto LAB_0014359a;
                      }
                      seqStore->lit = pBVar35 + uVar52;
                    }
                    uVar36 = lVar32 - 3;
                    psVar53 = seqStore->sequences;
                    psVar53->litLength = (U16)uVar52;
                    psVar53->offset = uVar43 + 3;
                    uVar30 = local_13c;
                    if (uVar36 < 0x10000) goto LAB_00143662;
                    if (seqStore->longLengthID == 0) goto LAB_00143641;
                    goto LAB_0014473c;
                  }
                  goto LAB_001446df;
                }
                goto LAB_001446c0;
              }
              goto LAB_001446fe;
            }
            goto LAB_0014471d;
          }
          piVar24 = (int *)(pBVar8 + uVar42);
          if (*piVar24 == (int)*puVar50) goto LAB_00142f7e;
LAB_0014302f:
          puVar50 = (ulong *)((long)puVar50 + ((long)puVar50 - (long)src >> 8) + 1);
        }
        local_13c = uVar43;
      } while (puVar50 < puVar5);
    }
  }
  else if (uVar40 == 6) {
    if (uVar42 < uVar37) goto LAB_001447f6;
    if (uVar39 < uVar43) goto LAB_00144815;
    puVar50 = (ulong *)((long)src + (ulong)(uVar39 == 0));
    if (uVar39 < uVar30) goto LAB_00144834;
    if (puVar50 < puVar5) {
      bVar25 = 0x40 - cVar18;
      bVar26 = 0x40 - cVar19;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar22 = iEnd + -4;
      do {
        uVar52 = *puVar50;
        uVar38 = uVar52 * -0x30e44323485a9b9d >> (bVar25 & 0x3f);
        uVar41 = uVar52 * -0x30e4432340650000 >> (bVar26 & 0x3f);
        iVar49 = (int)puVar50;
        UVar48 = iVar49 - iVar31;
        uVar40 = pUVar11[uVar38];
        uVar36 = (ulong)uVar40;
        UVar27 = UVar48 + 1;
        uVar37 = UVar27 - uVar43;
        piVar24 = (int *)(pBVar8 + uVar37);
        if (uVar37 < uVar16) {
          piVar24 = (int *)(pBVar10 + (uVar37 - uVar44));
        }
        uVar42 = pUVar12[uVar41];
        pUVar12[uVar41] = UVar48;
        pUVar11[uVar38] = UVar48;
        if ((uVar37 - uVar16 < 0xfffffffd) && (*piVar24 == *(int *)((long)puVar50 + 1))) {
          puVar51 = iEnd;
          if (uVar37 < uVar16) {
            puVar51 = mEnd;
          }
          sVar23 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar50 + 5),(BYTE *)(piVar24 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar51,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0014471d;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001446fe;
          puVar51 = (ulong *)((long)puVar50 + 1);
          uVar52 = (long)puVar51 - (long)src;
          puVar50 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar50 + uVar52))
          goto LAB_001446c0;
          if (iEnd < puVar51) goto LAB_001446df;
          if (puVar22 < puVar51) {
            ZSTD_safecopyLiterals((BYTE *)puVar50,(BYTE *)src,(BYTE *)puVar51,(BYTE *)puVar22);
LAB_00141f67:
            seqStore->lit = seqStore->lit + uVar52;
            if (0xffff < uVar52) {
              if (seqStore->longLengthID != 0) goto LAB_0014477a;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar36 = *(ulong *)((long)src + 8);
            *puVar50 = *src;
            puVar50[1] = uVar36;
            pBVar35 = seqStore->lit;
            if (0x10 < uVar52) {
              lVar32 = (long)(pBVar35 + 0x10) - ((long)src + 0x10);
              if (lVar32 < 8) {
                if (-0x10 < lVar32) goto LAB_00144799;
              }
              else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_001447b8;
              uVar36 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar35 + 0x18) = uVar36;
              if (0x20 < (long)uVar52) {
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)src + lVar32 + 0x20);
                  uVar17 = puVar6[1];
                  pBVar4 = pBVar35 + lVar32 + 0x20;
                  *(undefined8 *)pBVar4 = *puVar6;
                  *(undefined8 *)(pBVar4 + 8) = uVar17;
                  puVar6 = (undefined8 *)((long)src + lVar32 + 0x30);
                  uVar17 = puVar6[1];
                  *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                  *(undefined8 *)(pBVar4 + 0x18) = uVar17;
                  lVar32 = lVar32 + 0x20;
                } while (pBVar4 + 0x20 < pBVar35 + uVar52);
              }
              goto LAB_00141f67;
            }
            seqStore->lit = pBVar35 + uVar52;
          }
          lVar32 = sVar23 + 4;
          uVar36 = sVar23 + 1;
          psVar53 = seqStore->sequences;
          psVar53->litLength = (U16)uVar52;
          psVar53->offset = 1;
          uVar42 = uVar43;
          if (0xffff < uVar36) {
            if (seqStore->longLengthID != 0) goto LAB_0014473c;
LAB_00142879:
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar53 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_00142893:
          src = (void *)(lVar32 + (long)puVar51);
          psVar53->matchLength = (U16)uVar36;
          psVar53 = psVar53 + 1;
          seqStore->sequences = psVar53;
          puVar50 = (ulong *)src;
          uVar43 = uVar42;
          if (src <= puVar5) {
            uVar40 = UVar48 + 2;
            lVar32 = *(long *)(pBVar8 + uVar40);
            pUVar11[(ulong)(lVar32 * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] = uVar40;
            pUVar11[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] =
                 ((int)src + -2) - iVar31;
            pUVar12[(ulong)(lVar32 * -0x30e4432340650000) >> (bVar26 & 0x3f)] = uVar40;
            pUVar12[(ulong)(*(long *)((long)src + -1) * -0x30e4432340650000) >> (bVar26 & 0x3f)] =
                 ((int)src + -1) - iVar31;
            do {
              uVar37 = uVar30;
              UVar27 = (int)src - iVar31;
              uVar40 = UVar27 - uVar37;
              pBVar35 = pBVar8;
              if (uVar40 < uVar16) {
                pBVar35 = pBVar10 + -uVar45;
              }
              puVar50 = (ulong *)src;
              uVar30 = uVar37;
              uVar43 = uVar42;
              if ((0xfffffffc < uVar40 - uVar16) || (*(int *)(pBVar35 + uVar40) != (int)*src))
              break;
              puVar50 = iEnd;
              if (uVar40 < uVar16) {
                puVar50 = mEnd;
              }
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar35 + uVar40) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar50,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar53 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_0014471d;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001446fe;
              puVar50 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar50) goto LAB_001446c0;
              if (iEnd < src) goto LAB_001446df;
              if (puVar22 < src) {
                ZSTD_safecopyLiterals((BYTE *)puVar50,(BYTE *)src,(BYTE *)src,(BYTE *)puVar22);
              }
              else {
                uVar52 = *(ulong *)((long)src + 8);
                *puVar50 = *src;
                puVar50[1] = uVar52;
              }
              psVar53 = seqStore->sequences;
              psVar53->litLength = 0;
              psVar53->offset = 1;
              if (0xffff < sVar23 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_0014473c;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar53 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar53->matchLength = (U16)(sVar23 + 1);
              psVar53 = psVar53 + 1;
              seqStore->sequences = psVar53;
              uVar52 = *src;
              pUVar12[uVar52 * -0x30e4432340650000 >> (bVar26 & 0x3f)] = UVar27;
              pUVar11[uVar52 * -0x30e44323485a9b9d >> (bVar25 & 0x3f)] = UVar27;
              src = (void *)((long)src + sVar23 + 4);
              puVar50 = (ulong *)src;
              uVar30 = uVar42;
              uVar42 = uVar37;
              uVar43 = uVar37;
            } while (src <= puVar5);
          }
        }
        else {
          puVar51 = puVar50;
          if (uVar40 <= uVar16) {
            uVar40 = pUVar13[uVar52 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
            puVar29 = (ulong *)(pBVar10 + uVar40);
            if (puVar29 < mEnd) {
              if ((uVar40 <= uVar7) || (*puVar29 != uVar52)) goto LAB_00142117;
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)(puVar50 + 1),(BYTE *)(puVar29 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              lVar32 = sVar23 + 8;
              uVar42 = UVar48 - (uVar44 + uVar40);
              if (src < puVar50) {
                piVar24 = (int *)(pBVar10 + ((ulong)uVar40 - 1));
                puVar51 = (ulong *)((long)puVar50 + -1);
                do {
                  if ((char)*puVar51 != (char)*piVar24) goto LAB_00142352;
                  lVar32 = lVar32 + 1;
                  puVar50 = (ulong *)((long)puVar51 + -1);
                } while ((piVar28 < piVar24) &&
                        (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar51,
                        puVar51 = puVar50, bVar15));
                goto LAB_001426b3;
              }
              goto LAB_0014276a;
            }
            goto LAB_0014475b;
          }
          puVar29 = (ulong *)(pBVar8 + uVar36);
          if (*puVar29 == uVar52) {
            puVar47 = puVar50 + 1;
            puVar33 = puVar29 + 1;
            puVar46 = puVar47;
            if (puVar47 < puVar1) {
              if (*puVar33 == *puVar47) {
                lVar32 = 0;
                do {
                  puVar33 = (ulong *)((long)puVar50 + lVar32 + 0x10);
                  if (puVar1 <= puVar33) {
                    puVar33 = (ulong *)(pBVar8 + lVar32 + uVar36 + 0x10);
                    puVar46 = (ulong *)((long)puVar50 + lVar32 + 0x10);
                    goto LAB_0014251a;
                  }
                  lVar34 = lVar32 + uVar36 + 0x10;
                  uVar52 = *puVar33;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar8 + lVar34) == uVar52);
                uVar52 = uVar52 ^ *(ulong *)(pBVar8 + lVar34);
                uVar38 = 0;
                if (uVar52 != 0) {
                  for (; (uVar52 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar52 = (uVar38 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar38 = *puVar47 ^ *puVar33;
                uVar52 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                  }
                }
                uVar52 = uVar52 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0014251a:
              if ((puVar46 < puVar2) && ((int)*puVar33 == (int)*puVar46)) {
                puVar46 = (ulong *)((long)puVar46 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar46 < puVar3) && ((short)*puVar33 == (short)*puVar46)) {
                puVar46 = (ulong *)((long)puVar46 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar46 < iEnd) {
                puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar46));
              }
              uVar52 = (long)puVar46 - (long)puVar47;
            }
            lVar32 = uVar52 + 8;
            uVar42 = iVar49 - (int)puVar29;
            if (puVar50 <= src) goto LAB_0014276a;
            piVar24 = (int *)(pBVar8 + (uVar36 - 1));
            puVar51 = (ulong *)((long)puVar50 + -1);
            do {
              if ((char)*puVar51 != (char)*piVar24) goto LAB_0014275f;
              lVar32 = lVar32 + 1;
              puVar50 = (ulong *)((long)puVar51 + -1);
            } while ((iStart < piVar24) &&
                    (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar51,
                    puVar51 = puVar50, bVar15));
            goto LAB_001426b3;
          }
LAB_00142117:
          if (uVar42 <= uVar16) {
            uVar42 = pUVar14[uVar52 * -0x30e4432340650000 >> (0x40U - cVar21 & 0x3f)];
            if ((uVar42 <= uVar7) || (*(int *)(pBVar10 + uVar42) != (int)*puVar50))
            goto LAB_00142231;
            piVar24 = (int *)(pBVar10 + uVar42);
            uVar42 = uVar42 + uVar44;
LAB_0014216d:
            uVar52 = *(ulong *)((long)puVar50 + 1);
            uVar38 = uVar52 * -0x30e44323485a9b9d >> (bVar25 & 0x3f);
            puVar51 = (ulong *)((long)puVar50 + 1);
            uVar40 = pUVar11[uVar38];
            uVar36 = (ulong)uVar40;
            pUVar11[uVar38] = UVar27;
            if (uVar16 < uVar40) {
              puVar29 = (ulong *)(pBVar8 + uVar36);
              if (*puVar29 == uVar52) {
                puVar47 = (ulong *)((long)puVar50 + 9);
                puVar33 = puVar29 + 1;
                puVar46 = puVar47;
                if (puVar47 < puVar1) {
                  if (*puVar33 == *puVar47) {
                    lVar32 = 0;
                    do {
                      puVar33 = (ulong *)((long)puVar50 + lVar32 + 0x11);
                      if (puVar1 <= puVar33) {
                        puVar33 = (ulong *)(pBVar8 + lVar32 + uVar36 + 0x10);
                        puVar46 = (ulong *)((long)puVar50 + lVar32 + 0x11);
                        goto LAB_001426c9;
                      }
                      lVar34 = lVar32 + uVar36 + 0x10;
                      uVar52 = *puVar33;
                      lVar32 = lVar32 + 8;
                    } while (*(ulong *)(pBVar8 + lVar34) == uVar52);
                    uVar52 = uVar52 ^ *(ulong *)(pBVar8 + lVar34);
                    uVar38 = 0;
                    if (uVar52 != 0) {
                      for (; (uVar52 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar52 = (uVar38 >> 3 & 0x1fffffff) + lVar32;
                  }
                  else {
                    uVar38 = *puVar47 ^ *puVar33;
                    uVar52 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    uVar52 = uVar52 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001426c9:
                  if ((puVar46 < puVar2) && ((int)*puVar33 == (int)*puVar46)) {
                    puVar46 = (ulong *)((long)puVar46 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar46 < puVar3) && ((short)*puVar33 == (short)*puVar46)) {
                    puVar46 = (ulong *)((long)puVar46 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar46 < iEnd) {
                    puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar46));
                  }
                  uVar52 = (long)puVar46 - (long)puVar47;
                }
                lVar32 = uVar52 + 8;
                uVar42 = (int)puVar51 - (int)puVar29;
                if (src < puVar51) {
                  piVar24 = (int *)(pBVar8 + (uVar36 - 1));
                  do {
                    if ((char)*puVar50 != (char)*piVar24) goto LAB_001426b3;
                    lVar32 = lVar32 + 1;
                    puVar51 = (ulong *)((long)puVar50 + -1);
                  } while ((iStart < piVar24) &&
                          (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar50,
                          puVar50 = puVar51, bVar15));
LAB_0014275f:
                  puVar51 = (ulong *)((long)puVar51 + 1);
                }
              }
              else {
LAB_0014235d:
                puVar51 = (ulong *)((long)puVar50 + 4);
                puVar29 = (ulong *)(piVar24 + 1);
                if (uVar42 < uVar16) {
                  sVar23 = ZSTD_count_2segments
                                     ((BYTE *)puVar51,(BYTE *)puVar29,(BYTE *)iEnd,(BYTE *)mEnd,
                                      (BYTE *)iStart);
                  lVar32 = sVar23 + 4;
                  uVar42 = UVar48 - uVar42;
                  puVar51 = puVar50;
                  if ((piVar28 < piVar24) && (src < puVar50)) {
                    puVar51 = (ulong *)((long)puVar50 + -1);
                    do {
                      piVar24 = (int *)((long)piVar24 + -1);
                      if ((char)*puVar51 != *(char *)piVar24) goto LAB_00142352;
                      lVar32 = lVar32 + 1;
                      puVar50 = (ulong *)((long)puVar51 + -1);
                    } while ((piVar28 < piVar24) &&
                            (bVar15 = src < puVar51, puVar51 = puVar50, bVar15));
LAB_001426b3:
                    puVar51 = (ulong *)((long)puVar50 + 1);
                  }
                }
                else {
                  puVar47 = puVar51;
                  if (puVar51 < puVar1) {
                    if (*puVar29 == *puVar51) {
                      lVar32 = 0;
                      do {
                        puVar29 = (ulong *)((long)puVar50 + lVar32 + 0xc);
                        if (puVar1 <= puVar29) {
                          puVar29 = (ulong *)((long)piVar24 + lVar32 + 0xc);
                          puVar47 = (ulong *)((long)puVar50 + lVar32 + 0xc);
                          goto LAB_0014261b;
                        }
                        uVar52 = *(ulong *)((long)piVar24 + lVar32 + 0xc);
                        uVar36 = *puVar29;
                        lVar32 = lVar32 + 8;
                      } while (uVar52 == uVar36);
                      uVar36 = uVar36 ^ uVar52;
                      uVar52 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                        }
                      }
                      uVar52 = (uVar52 >> 3 & 0x1fffffff) + lVar32;
                    }
                    else {
                      uVar36 = *puVar51 ^ *puVar29;
                      uVar52 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                        }
                      }
                      uVar52 = uVar52 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_0014261b:
                    if ((puVar47 < puVar2) && ((int)*puVar29 == (int)*puVar47)) {
                      puVar47 = (ulong *)((long)puVar47 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar47 < puVar3) && ((short)*puVar29 == (short)*puVar47)) {
                      puVar47 = (ulong *)((long)puVar47 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar47 < iEnd) {
                      puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar47))
                      ;
                    }
                    uVar52 = (long)puVar47 - (long)puVar51;
                  }
                  lVar32 = uVar52 + 4;
                  uVar42 = iVar49 - (int)piVar24;
                  puVar51 = puVar50;
                  if ((iStart < piVar24) && (src < puVar50)) {
                    puVar51 = (ulong *)((long)puVar50 + -1);
                    do {
                      piVar24 = (int *)((long)piVar24 + -1);
                      if ((char)*puVar51 != *(char *)piVar24) goto LAB_00142352;
                      lVar32 = lVar32 + 1;
                      puVar50 = (ulong *)((long)puVar51 + -1);
                    } while ((iStart < piVar24) &&
                            (bVar15 = src < puVar51, puVar51 = puVar50, bVar15));
                    goto LAB_001426b3;
                  }
                }
              }
            }
            else {
              uVar40 = pUVar13[uVar52 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
              puVar29 = (ulong *)(pBVar10 + uVar40);
              if (mEnd <= puVar29) goto LAB_001447d7;
              if ((uVar40 <= uVar7) || (*puVar29 != uVar52)) goto LAB_0014235d;
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar50 + 9),(BYTE *)(puVar29 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              lVar32 = sVar23 + 8;
              uVar42 = UVar27 - (uVar44 + uVar40);
              if (src < puVar51) {
                piVar24 = (int *)(pBVar10 + ((ulong)uVar40 - 1));
                do {
                  if ((char)*puVar50 != (char)*piVar24) goto LAB_001426b3;
                  lVar32 = lVar32 + 1;
                  puVar51 = (ulong *)((long)puVar50 + -1);
                } while ((piVar28 < piVar24) &&
                        (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar50,
                        puVar50 = puVar51, bVar15));
LAB_00142352:
                puVar51 = (ulong *)((long)puVar51 + 1);
              }
            }
LAB_0014276a:
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar52 = (long)puVar51 - (long)src;
                puVar50 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar50 + uVar52) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (puVar51 <= iEnd) {
                    if (puVar22 < puVar51) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar50,(BYTE *)src,(BYTE *)puVar51,(BYTE *)puVar22);
LAB_001427d3:
                      seqStore->lit = seqStore->lit + uVar52;
                      if (0xffff < uVar52) {
                        if (seqStore->longLengthID != 0) goto LAB_0014477a;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = *(ulong *)((long)src + 8);
                      *puVar50 = *src;
                      puVar50[1] = uVar36;
                      pBVar35 = seqStore->lit;
                      if (0x10 < uVar52) {
                        lVar34 = (long)(pBVar35 + 0x10) - ((long)src + 0x10);
                        if (lVar34 < 8) {
                          if (-0x10 < lVar34) goto LAB_00144799;
                        }
                        else if (0xffffffffffffffe0 < lVar34 - 0x10U) goto LAB_001447b8;
                        uVar36 = *(ulong *)((long)src + 0x18);
                        *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
                        *(ulong *)(pBVar35 + 0x18) = uVar36;
                        if (0x20 < (long)uVar52) {
                          lVar34 = 0;
                          do {
                            puVar6 = (undefined8 *)((long)src + lVar34 + 0x20);
                            uVar17 = puVar6[1];
                            pBVar4 = pBVar35 + lVar34 + 0x20;
                            *(undefined8 *)pBVar4 = *puVar6;
                            *(undefined8 *)(pBVar4 + 8) = uVar17;
                            puVar6 = (undefined8 *)((long)src + lVar34 + 0x30);
                            uVar17 = puVar6[1];
                            *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                            *(undefined8 *)(pBVar4 + 0x18) = uVar17;
                            lVar34 = lVar34 + 0x20;
                          } while (pBVar4 + 0x20 < pBVar35 + uVar52);
                        }
                        goto LAB_001427d3;
                      }
                      seqStore->lit = pBVar35 + uVar52;
                    }
                    uVar36 = lVar32 - 3;
                    psVar53 = seqStore->sequences;
                    psVar53->litLength = (U16)uVar52;
                    psVar53->offset = uVar42 + 3;
                    uVar30 = uVar43;
                    if (uVar36 < 0x10000) goto LAB_00142893;
                    if (seqStore->longLengthID == 0) goto LAB_00142879;
                    goto LAB_0014473c;
                  }
                  goto LAB_001446df;
                }
                goto LAB_001446c0;
              }
              goto LAB_001446fe;
            }
            goto LAB_0014471d;
          }
          piVar24 = (int *)(pBVar8 + uVar42);
          if (*piVar24 == (int)*puVar50) goto LAB_0014216d;
LAB_00142231:
          puVar50 = (ulong *)((long)puVar50 + ((long)puVar50 - (long)src >> 8) + 1);
        }
      } while (puVar50 < puVar5);
    }
  }
  else if (uVar40 == 7) {
    if (uVar42 < uVar37) {
LAB_001447f6:
      __assert_fail("lowestValid + maxDistance >= endIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b45,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if (uVar39 < uVar43) {
LAB_00144815:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b52,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    puVar50 = (ulong *)((long)src + (ulong)(uVar39 == 0));
    if (uVar39 < uVar30) {
LAB_00144834:
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b53,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if (puVar50 < puVar5) {
      bVar25 = 0x40 - cVar18;
      bVar26 = 0x40 - cVar19;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar22 = iEnd + -4;
      do {
        uVar52 = *puVar50;
        uVar38 = uVar52 * -0x30e44323485a9b9d >> (bVar25 & 0x3f);
        uVar41 = uVar52 * -0x30e44323405a9d00 >> (bVar26 & 0x3f);
        iVar49 = (int)puVar50;
        UVar48 = iVar49 - iVar31;
        uVar40 = pUVar11[uVar38];
        uVar36 = (ulong)uVar40;
        UVar27 = UVar48 + 1;
        uVar37 = UVar27 - local_13c;
        piVar24 = (int *)(pBVar8 + uVar37);
        if (uVar37 < uVar16) {
          piVar24 = (int *)(pBVar10 + (uVar37 - uVar44));
        }
        uVar42 = pUVar12[uVar41];
        pUVar12[uVar41] = UVar48;
        pUVar11[uVar38] = UVar48;
        uVar43 = local_13c;
        if ((uVar37 - uVar16 < 0xfffffffd) && (*piVar24 == *(int *)((long)puVar50 + 1))) {
          puVar51 = iEnd;
          if (uVar37 < uVar16) {
            puVar51 = mEnd;
          }
          sVar23 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar50 + 5),(BYTE *)(piVar24 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar51,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0014471d:
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
LAB_001446fe:
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          puVar51 = (ulong *)((long)puVar50 + 1);
          uVar52 = (long)puVar51 - (long)src;
          puVar50 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar50 + uVar52)) {
LAB_001446c0:
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (iEnd < puVar51) {
LAB_001446df:
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (puVar22 < puVar51) {
            ZSTD_safecopyLiterals((BYTE *)puVar50,(BYTE *)src,(BYTE *)puVar51,(BYTE *)puVar22);
LAB_00141197:
            seqStore->lit = seqStore->lit + uVar52;
            if (0xffff < uVar52) {
              if (seqStore->longLengthID != 0) {
LAB_0014477a:
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar36 = *(ulong *)((long)src + 8);
            *puVar50 = *src;
            puVar50[1] = uVar36;
            pBVar35 = seqStore->lit;
            if (0x10 < uVar52) {
              lVar32 = (long)(pBVar35 + 0x10) - ((long)src + 0x10);
              if (lVar32 < 8) {
                if (-0x10 < lVar32) {
LAB_00144799:
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
              }
              else if (0xffffffffffffffe0 < lVar32 - 0x10U) {
LAB_001447b8:
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              uVar36 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar35 + 0x18) = uVar36;
              if (0x20 < (long)uVar52) {
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)src + lVar32 + 0x20);
                  uVar17 = puVar6[1];
                  pBVar4 = pBVar35 + lVar32 + 0x20;
                  *(undefined8 *)pBVar4 = *puVar6;
                  *(undefined8 *)(pBVar4 + 8) = uVar17;
                  puVar6 = (undefined8 *)((long)src + lVar32 + 0x30);
                  uVar17 = puVar6[1];
                  *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                  *(undefined8 *)(pBVar4 + 0x18) = uVar17;
                  lVar32 = lVar32 + 0x20;
                } while (pBVar4 + 0x20 < pBVar35 + uVar52);
              }
              goto LAB_00141197;
            }
            seqStore->lit = pBVar35 + uVar52;
          }
          lVar32 = sVar23 + 4;
          uVar36 = sVar23 + 1;
          psVar53 = seqStore->sequences;
          psVar53->litLength = (U16)uVar52;
          psVar53->offset = 1;
          if (0xffff < uVar36) {
            if (seqStore->longLengthID != 0) goto LAB_0014473c;
LAB_00141a5c:
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar53 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_00141a7d:
          src = (void *)(lVar32 + (long)puVar51);
          psVar53->matchLength = (U16)uVar36;
          psVar53 = psVar53 + 1;
          seqStore->sequences = psVar53;
          puVar50 = (ulong *)src;
          if (src <= puVar5) {
            uVar40 = UVar48 + 2;
            lVar32 = *(long *)(pBVar8 + uVar40);
            pUVar11[(ulong)(lVar32 * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] = uVar40;
            pUVar11[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] =
                 ((int)src + -2) - iVar31;
            pUVar12[(ulong)(lVar32 * -0x30e44323405a9d00) >> (bVar26 & 0x3f)] = uVar40;
            pUVar12[(ulong)(*(long *)((long)src + -1) * -0x30e44323405a9d00) >> (bVar26 & 0x3f)] =
                 ((int)src + -1) - iVar31;
            uVar40 = uVar30;
            do {
              uVar42 = uVar43;
              UVar27 = (int)src - iVar31;
              uVar37 = UVar27 - uVar40;
              pBVar35 = pBVar8;
              if (uVar37 < uVar16) {
                pBVar35 = pBVar10 + -uVar45;
              }
              puVar50 = (ulong *)src;
              uVar30 = uVar40;
              uVar43 = uVar42;
              if ((0xfffffffc < uVar37 - uVar16) || (*(int *)(pBVar35 + uVar37) != (int)*src))
              break;
              puVar50 = iEnd;
              if (uVar37 < uVar16) {
                puVar50 = mEnd;
              }
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar35 + uVar37) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar50,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar53 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_0014471d;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001446fe;
              puVar50 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar50) goto LAB_001446c0;
              if (iEnd < src) goto LAB_001446df;
              if (puVar22 < src) {
                ZSTD_safecopyLiterals((BYTE *)puVar50,(BYTE *)src,(BYTE *)src,(BYTE *)puVar22);
              }
              else {
                uVar52 = *(ulong *)((long)src + 8);
                *puVar50 = *src;
                puVar50[1] = uVar52;
              }
              psVar53 = seqStore->sequences;
              psVar53->litLength = 0;
              psVar53->offset = 1;
              if (0xffff < sVar23 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_0014473c;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar53 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar53->matchLength = (U16)(sVar23 + 1);
              psVar53 = psVar53 + 1;
              seqStore->sequences = psVar53;
              uVar52 = *src;
              pUVar12[uVar52 * -0x30e44323405a9d00 >> (bVar26 & 0x3f)] = UVar27;
              pUVar11[uVar52 * -0x30e44323485a9b9d >> (bVar25 & 0x3f)] = UVar27;
              src = (void *)((long)src + sVar23 + 4);
              puVar50 = (ulong *)src;
              uVar30 = uVar42;
              uVar43 = uVar40;
              uVar40 = uVar42;
            } while (src <= puVar5);
          }
        }
        else {
          puVar51 = puVar50;
          if (uVar40 <= uVar16) {
            uVar40 = pUVar13[uVar52 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
            puVar29 = (ulong *)(pBVar10 + uVar40);
            if (mEnd <= puVar29) {
LAB_0014475b:
              __assert_fail("dictMatchL < dictEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3b8a,
                            "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                           );
            }
            if ((uVar40 <= uVar7) || (*puVar29 != uVar52)) goto LAB_00141341;
            sVar23 = ZSTD_count_2segments
                               ((BYTE *)(puVar50 + 1),(BYTE *)(puVar29 + 1),(BYTE *)iEnd,
                                (BYTE *)mEnd,(BYTE *)iStart);
            lVar32 = sVar23 + 8;
            uVar43 = UVar48 - (uVar44 + uVar40);
            if (src < puVar50) {
              piVar24 = (int *)(pBVar10 + ((ulong)uVar40 - 1));
              puVar51 = (ulong *)((long)puVar50 + -1);
              do {
                if ((char)*puVar51 != (char)*piVar24) goto LAB_00141563;
                lVar32 = lVar32 + 1;
                puVar50 = (ulong *)((long)puVar51 + -1);
              } while ((piVar28 < piVar24) &&
                      (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar51,
                      puVar51 = puVar50, bVar15));
              goto LAB_001418a0;
            }
            goto LAB_0014194c;
          }
          puVar29 = (ulong *)(pBVar8 + uVar36);
          if (*puVar29 == uVar52) {
            puVar47 = puVar50 + 1;
            puVar33 = puVar29 + 1;
            puVar46 = puVar47;
            if (puVar47 < puVar1) {
              if (*puVar33 == *puVar47) {
                lVar32 = 0;
                do {
                  puVar33 = (ulong *)((long)puVar50 + lVar32 + 0x10);
                  if (puVar1 <= puVar33) {
                    puVar33 = (ulong *)(pBVar8 + lVar32 + uVar36 + 0x10);
                    puVar46 = (ulong *)((long)puVar50 + lVar32 + 0x10);
                    goto LAB_00141717;
                  }
                  lVar34 = lVar32 + uVar36 + 0x10;
                  uVar52 = *puVar33;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar8 + lVar34) == uVar52);
                uVar52 = uVar52 ^ *(ulong *)(pBVar8 + lVar34);
                uVar38 = 0;
                if (uVar52 != 0) {
                  for (; (uVar52 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar52 = (uVar38 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar38 = *puVar47 ^ *puVar33;
                uVar52 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                  }
                }
                uVar52 = uVar52 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00141717:
              if ((puVar46 < puVar2) && ((int)*puVar33 == (int)*puVar46)) {
                puVar46 = (ulong *)((long)puVar46 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar46 < puVar3) && ((short)*puVar33 == (short)*puVar46)) {
                puVar46 = (ulong *)((long)puVar46 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar46 < iEnd) {
                puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar46));
              }
              uVar52 = (long)puVar46 - (long)puVar47;
            }
            lVar32 = uVar52 + 8;
            uVar43 = iVar49 - (int)puVar29;
            if (puVar50 <= src) goto LAB_0014194c;
            piVar24 = (int *)(pBVar8 + (uVar36 - 1));
            puVar51 = (ulong *)((long)puVar50 + -1);
            do {
              if ((char)*puVar51 != (char)*piVar24) goto LAB_00141941;
              lVar32 = lVar32 + 1;
              puVar50 = (ulong *)((long)puVar51 + -1);
            } while ((iStart < piVar24) &&
                    (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar51,
                    puVar51 = puVar50, bVar15));
            goto LAB_001418a0;
          }
LAB_00141341:
          if (uVar42 <= uVar16) {
            uVar42 = pUVar14[uVar52 * -0x30e44323405a9d00 >> (0x40U - cVar21 & 0x3f)];
            if ((uVar42 <= uVar7) || (*(int *)(pBVar10 + uVar42) != (int)*puVar50))
            goto LAB_0014144a;
            piVar24 = (int *)(pBVar10 + uVar42);
            uVar42 = uVar42 + uVar44;
LAB_00141399:
            uVar52 = *(ulong *)((long)puVar50 + 1);
            uVar38 = uVar52 * -0x30e44323485a9b9d >> (bVar25 & 0x3f);
            puVar51 = (ulong *)((long)puVar50 + 1);
            uVar40 = pUVar11[uVar38];
            uVar36 = (ulong)uVar40;
            pUVar11[uVar38] = UVar27;
            if (uVar16 < uVar40) {
              puVar29 = (ulong *)(pBVar8 + uVar36);
              if (*puVar29 == uVar52) {
                puVar47 = (ulong *)((long)puVar50 + 9);
                puVar33 = puVar29 + 1;
                puVar46 = puVar47;
                if (puVar47 < puVar1) {
                  if (*puVar33 == *puVar47) {
                    lVar32 = 0;
                    do {
                      puVar33 = (ulong *)((long)puVar50 + lVar32 + 0x11);
                      if (puVar1 <= puVar33) {
                        puVar33 = (ulong *)(pBVar8 + lVar32 + uVar36 + 0x10);
                        puVar46 = (ulong *)((long)puVar50 + lVar32 + 0x11);
                        goto LAB_001418b3;
                      }
                      lVar34 = lVar32 + uVar36 + 0x10;
                      uVar52 = *puVar33;
                      lVar32 = lVar32 + 8;
                    } while (*(ulong *)(pBVar8 + lVar34) == uVar52);
                    uVar52 = uVar52 ^ *(ulong *)(pBVar8 + lVar34);
                    uVar38 = 0;
                    if (uVar52 != 0) {
                      for (; (uVar52 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar52 = (uVar38 >> 3 & 0x1fffffff) + lVar32;
                  }
                  else {
                    uVar38 = *puVar47 ^ *puVar33;
                    uVar52 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    uVar52 = uVar52 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001418b3:
                  if ((puVar46 < puVar2) && ((int)*puVar33 == (int)*puVar46)) {
                    puVar46 = (ulong *)((long)puVar46 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar46 < puVar3) && ((short)*puVar33 == (short)*puVar46)) {
                    puVar46 = (ulong *)((long)puVar46 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar46 < iEnd) {
                    puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar46));
                  }
                  uVar52 = (long)puVar46 - (long)puVar47;
                }
                lVar32 = uVar52 + 8;
                uVar43 = (int)puVar51 - (int)puVar29;
                if (src < puVar51) {
                  piVar24 = (int *)(pBVar8 + (uVar36 - 1));
                  do {
                    if ((char)*puVar50 != (char)*piVar24) goto LAB_001418a0;
                    lVar32 = lVar32 + 1;
                    puVar51 = (ulong *)((long)puVar50 + -1);
                  } while ((iStart < piVar24) &&
                          (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar50,
                          puVar50 = puVar51, bVar15));
LAB_00141941:
                  puVar51 = (ulong *)((long)puVar51 + 1);
                }
              }
              else {
LAB_0014156e:
                puVar51 = (ulong *)((long)puVar50 + 4);
                puVar29 = (ulong *)(piVar24 + 1);
                if (uVar42 < uVar16) {
                  sVar23 = ZSTD_count_2segments
                                     ((BYTE *)puVar51,(BYTE *)puVar29,(BYTE *)iEnd,(BYTE *)mEnd,
                                      (BYTE *)iStart);
                  lVar32 = sVar23 + 4;
                  uVar43 = UVar48 - uVar42;
                  puVar51 = puVar50;
                  if ((piVar28 < piVar24) && (src < puVar50)) {
                    puVar51 = (ulong *)((long)puVar50 + -1);
                    do {
                      piVar24 = (int *)((long)piVar24 + -1);
                      if ((char)*puVar51 != *(char *)piVar24) goto LAB_00141563;
                      lVar32 = lVar32 + 1;
                      puVar50 = (ulong *)((long)puVar51 + -1);
                    } while ((piVar28 < piVar24) &&
                            (bVar15 = src < puVar51, puVar51 = puVar50, bVar15));
LAB_001418a0:
                    puVar51 = (ulong *)((long)puVar50 + 1);
                  }
                }
                else {
                  puVar47 = puVar51;
                  if (puVar51 < puVar1) {
                    if (*puVar29 == *puVar51) {
                      lVar32 = 0;
                      do {
                        puVar29 = (ulong *)((long)puVar50 + lVar32 + 0xc);
                        if (puVar1 <= puVar29) {
                          puVar29 = (ulong *)((long)piVar24 + lVar32 + 0xc);
                          puVar47 = (ulong *)((long)puVar50 + lVar32 + 0xc);
                          goto LAB_00141805;
                        }
                        uVar52 = *(ulong *)((long)piVar24 + lVar32 + 0xc);
                        uVar36 = *puVar29;
                        lVar32 = lVar32 + 8;
                      } while (uVar52 == uVar36);
                      uVar36 = uVar36 ^ uVar52;
                      uVar52 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                        }
                      }
                      uVar52 = (uVar52 >> 3 & 0x1fffffff) + lVar32;
                    }
                    else {
                      uVar36 = *puVar51 ^ *puVar29;
                      uVar52 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                        }
                      }
                      uVar52 = uVar52 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_00141805:
                    if ((puVar47 < puVar2) && ((int)*puVar29 == (int)*puVar47)) {
                      puVar47 = (ulong *)((long)puVar47 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar47 < puVar3) && ((short)*puVar29 == (short)*puVar47)) {
                      puVar47 = (ulong *)((long)puVar47 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar47 < iEnd) {
                      puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar47))
                      ;
                    }
                    uVar52 = (long)puVar47 - (long)puVar51;
                  }
                  lVar32 = uVar52 + 4;
                  uVar43 = iVar49 - (int)piVar24;
                  puVar51 = puVar50;
                  if ((iStart < piVar24) && (src < puVar50)) {
                    puVar51 = (ulong *)((long)puVar50 + -1);
                    do {
                      piVar24 = (int *)((long)piVar24 + -1);
                      if ((char)*puVar51 != *(char *)piVar24) goto LAB_00141563;
                      lVar32 = lVar32 + 1;
                      puVar50 = (ulong *)((long)puVar51 + -1);
                    } while ((iStart < piVar24) &&
                            (bVar15 = src < puVar51, puVar51 = puVar50, bVar15));
                    goto LAB_001418a0;
                  }
                }
              }
            }
            else {
              uVar40 = pUVar13[uVar52 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
              puVar29 = (ulong *)(pBVar10 + uVar40);
              if (mEnd <= puVar29) {
LAB_001447d7:
                __assert_fail("dictMatchL3 < dictEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x3bbd,
                              "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                             );
              }
              if ((uVar40 <= uVar7) || (*puVar29 != uVar52)) goto LAB_0014156e;
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar50 + 9),(BYTE *)(puVar29 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              lVar32 = sVar23 + 8;
              uVar43 = UVar27 - (uVar44 + uVar40);
              if (src < puVar51) {
                piVar24 = (int *)(pBVar10 + ((ulong)uVar40 - 1));
                do {
                  if ((char)*puVar50 != (char)*piVar24) goto LAB_001418a0;
                  lVar32 = lVar32 + 1;
                  puVar51 = (ulong *)((long)puVar50 + -1);
                } while ((piVar28 < piVar24) &&
                        (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar50,
                        puVar50 = puVar51, bVar15));
LAB_00141563:
                puVar51 = (ulong *)((long)puVar51 + 1);
              }
            }
LAB_0014194c:
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar52 = (long)puVar51 - (long)src;
                puVar50 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar50 + uVar52) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (puVar51 <= iEnd) {
                    if (puVar22 < puVar51) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar50,(BYTE *)src,(BYTE *)puVar51,(BYTE *)puVar22);
LAB_001419b5:
                      seqStore->lit = seqStore->lit + uVar52;
                      if (0xffff < uVar52) {
                        if (seqStore->longLengthID != 0) goto LAB_0014477a;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = *(ulong *)((long)src + 8);
                      *puVar50 = *src;
                      puVar50[1] = uVar36;
                      pBVar35 = seqStore->lit;
                      if (0x10 < uVar52) {
                        lVar34 = (long)(pBVar35 + 0x10) - ((long)src + 0x10);
                        if (lVar34 < 8) {
                          if (-0x10 < lVar34) goto LAB_00144799;
                        }
                        else if (0xffffffffffffffe0 < lVar34 - 0x10U) goto LAB_001447b8;
                        uVar36 = *(ulong *)((long)src + 0x18);
                        *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
                        *(ulong *)(pBVar35 + 0x18) = uVar36;
                        if (0x20 < (long)uVar52) {
                          lVar34 = 0;
                          do {
                            puVar6 = (undefined8 *)((long)src + lVar34 + 0x20);
                            uVar17 = puVar6[1];
                            pBVar4 = pBVar35 + lVar34 + 0x20;
                            *(undefined8 *)pBVar4 = *puVar6;
                            *(undefined8 *)(pBVar4 + 8) = uVar17;
                            puVar6 = (undefined8 *)((long)src + lVar34 + 0x30);
                            uVar17 = puVar6[1];
                            *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                            *(undefined8 *)(pBVar4 + 0x18) = uVar17;
                            lVar34 = lVar34 + 0x20;
                          } while (pBVar4 + 0x20 < pBVar35 + uVar52);
                        }
                        goto LAB_001419b5;
                      }
                      seqStore->lit = pBVar35 + uVar52;
                    }
                    uVar36 = lVar32 - 3;
                    psVar53 = seqStore->sequences;
                    psVar53->litLength = (U16)uVar52;
                    psVar53->offset = uVar43 + 3;
                    uVar30 = local_13c;
                    if (uVar36 < 0x10000) goto LAB_00141a7d;
                    if (seqStore->longLengthID == 0) goto LAB_00141a5c;
LAB_0014473c:
                    __assert_fail("seqStorePtr->longLengthID == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x2058,
                                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                                 );
                  }
                  goto LAB_001446df;
                }
                goto LAB_001446c0;
              }
              goto LAB_001446fe;
            }
            goto LAB_0014471d;
          }
          piVar24 = (int *)(pBVar8 + uVar42);
          if (*piVar24 == (int)*puVar50) goto LAB_00141399;
LAB_0014144a:
          puVar50 = (ulong *)((long)puVar50 + ((long)puVar50 - (long)src >> 8) + 1);
        }
        local_13c = uVar43;
      } while (puVar50 < puVar5);
    }
  }
  else {
    if (uVar42 < uVar37) goto LAB_001447f6;
    if (uVar39 < uVar43) goto LAB_00144815;
    puVar50 = (ulong *)((long)src + (ulong)(uVar39 == 0));
    if (uVar39 < uVar30) goto LAB_00144834;
    if (puVar50 < puVar5) {
      bVar25 = 0x40 - cVar18;
      bVar26 = 0x20 - cVar19;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar22 = iEnd + -4;
      do {
        uVar42 = (int)*puVar50 * -0x61c8864f;
        uVar36 = *puVar50 * -0x30e44323485a9b9d;
        uVar38 = uVar36 >> (bVar25 & 0x3f);
        uVar43 = uVar42 >> (bVar26 & 0x1f);
        iVar49 = (int)puVar50;
        UVar48 = iVar49 - iVar31;
        uVar40 = pUVar11[uVar38];
        uVar52 = (ulong)uVar40;
        UVar27 = UVar48 + 1;
        uVar37 = UVar27 - local_13c;
        piVar24 = (int *)(pBVar8 + uVar37);
        if (uVar37 < uVar16) {
          piVar24 = (int *)(pBVar10 + (uVar37 - uVar44));
        }
        uVar39 = pUVar12[uVar43];
        pUVar12[uVar43] = UVar48;
        pUVar11[uVar38] = UVar48;
        uVar43 = local_13c;
        if ((uVar37 - uVar16 < 0xfffffffd) && (*piVar24 == *(int *)((long)puVar50 + 1))) {
          puVar51 = iEnd;
          if (uVar37 < uVar16) {
            puVar51 = mEnd;
          }
          sVar23 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar50 + 5),(BYTE *)(piVar24 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar51,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0014471d;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001446fe;
          puVar51 = (ulong *)((long)puVar50 + 1);
          uVar52 = (long)puVar51 - (long)src;
          puVar50 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar50 + uVar52))
          goto LAB_001446c0;
          if (iEnd < puVar51) goto LAB_001446df;
          if (puVar22 < puVar51) {
            ZSTD_safecopyLiterals((BYTE *)puVar50,(BYTE *)src,(BYTE *)puVar51,(BYTE *)puVar22);
LAB_00143b15:
            seqStore->lit = seqStore->lit + uVar52;
            if (0xffff < uVar52) {
              if (seqStore->longLengthID != 0) goto LAB_0014477a;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar36 = *(ulong *)((long)src + 8);
            *puVar50 = *src;
            puVar50[1] = uVar36;
            pBVar35 = seqStore->lit;
            if (0x10 < uVar52) {
              lVar32 = (long)(pBVar35 + 0x10) - ((long)src + 0x10);
              if (lVar32 < 8) {
                if (-0x10 < lVar32) goto LAB_00144799;
              }
              else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_001447b8;
              uVar36 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar35 + 0x18) = uVar36;
              if (0x20 < (long)uVar52) {
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)src + lVar32 + 0x20);
                  uVar17 = puVar6[1];
                  pBVar4 = pBVar35 + lVar32 + 0x20;
                  *(undefined8 *)pBVar4 = *puVar6;
                  *(undefined8 *)(pBVar4 + 8) = uVar17;
                  puVar6 = (undefined8 *)((long)src + lVar32 + 0x30);
                  uVar17 = puVar6[1];
                  *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                  *(undefined8 *)(pBVar4 + 0x18) = uVar17;
                  lVar32 = lVar32 + 0x20;
                } while (pBVar4 + 0x20 < pBVar35 + uVar52);
              }
              goto LAB_00143b15;
            }
            seqStore->lit = pBVar35 + uVar52;
          }
          lVar32 = sVar23 + 4;
          uVar36 = sVar23 + 1;
          psVar53 = seqStore->sequences;
          psVar53->litLength = (U16)uVar52;
          psVar53->offset = 1;
          if (0xffff < uVar36) {
            if (seqStore->longLengthID != 0) goto LAB_0014473c;
LAB_001443ec:
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar53 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_0014440d:
          src = (void *)(lVar32 + (long)puVar51);
          psVar53->matchLength = (U16)uVar36;
          psVar53 = psVar53 + 1;
          seqStore->sequences = psVar53;
          puVar50 = (ulong *)src;
          if (src <= puVar5) {
            uVar40 = UVar48 + 2;
            pUVar11[(ulong)(*(long *)(pBVar8 + uVar40) * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] =
                 uVar40;
            pUVar11[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] =
                 ((int)src + -2) - iVar31;
            pUVar12[(uint)(*(int *)(pBVar8 + uVar40) * -0x61c8864f) >> (bVar26 & 0x1f)] = uVar40;
            pUVar12[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar26 & 0x1f)] =
                 ((int)src + -1) - iVar31;
            uVar40 = uVar30;
            do {
              uVar42 = uVar43;
              UVar27 = (int)src - iVar31;
              uVar37 = UVar27 - uVar40;
              pBVar35 = pBVar8;
              if (uVar37 < uVar16) {
                pBVar35 = pBVar10 + -uVar45;
              }
              puVar50 = (ulong *)src;
              uVar30 = uVar40;
              uVar43 = uVar42;
              if ((0xfffffffc < uVar37 - uVar16) || (*(int *)(pBVar35 + uVar37) != (int)*src))
              break;
              puVar50 = iEnd;
              if (uVar37 < uVar16) {
                puVar50 = mEnd;
              }
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar35 + uVar37) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar50,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar53 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_0014471d;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001446fe;
              puVar50 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar50) goto LAB_001446c0;
              if (iEnd < src) goto LAB_001446df;
              if (puVar22 < src) {
                ZSTD_safecopyLiterals((BYTE *)puVar50,(BYTE *)src,(BYTE *)src,(BYTE *)puVar22);
              }
              else {
                uVar52 = *(ulong *)((long)src + 8);
                *puVar50 = *src;
                puVar50[1] = uVar52;
              }
              psVar53 = seqStore->sequences;
              psVar53->litLength = 0;
              psVar53->offset = 1;
              if (0xffff < sVar23 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_0014473c;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar53 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar53->matchLength = (U16)(sVar23 + 1);
              psVar53 = psVar53 + 1;
              seqStore->sequences = psVar53;
              pUVar12[(uint)((int)*src * -0x61c8864f) >> (bVar26 & 0x1f)] = UVar27;
              pUVar11[*src * -0x30e44323485a9b9d >> (bVar25 & 0x3f)] = UVar27;
              src = (void *)((long)src + sVar23 + 4);
              puVar50 = (ulong *)src;
              uVar30 = uVar42;
              uVar43 = uVar40;
              uVar40 = uVar42;
            } while (src <= puVar5);
          }
        }
        else {
          puVar51 = puVar50;
          if (uVar40 <= uVar16) {
            uVar40 = pUVar13[uVar36 >> (0x40U - cVar20 & 0x3f)];
            puVar29 = (ulong *)(pBVar10 + uVar40);
            if (puVar29 < mEnd) {
              if ((uVar40 <= uVar7) || (*puVar29 != *puVar50)) goto LAB_00143cb2;
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)(puVar50 + 1),(BYTE *)(puVar29 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              lVar32 = sVar23 + 8;
              uVar43 = UVar48 - (uVar44 + uVar40);
              if (src < puVar50) {
                piVar24 = (int *)(pBVar10 + ((ulong)uVar40 - 1));
                puVar51 = (ulong *)((long)puVar50 + -1);
                do {
                  if ((char)*puVar51 != (char)*piVar24) goto LAB_00143eea;
                  lVar32 = lVar32 + 1;
                  puVar50 = (ulong *)((long)puVar51 + -1);
                } while ((piVar28 < piVar24) &&
                        (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar51,
                        puVar51 = puVar50, bVar15));
                goto LAB_0014422d;
              }
              goto LAB_001442dc;
            }
            goto LAB_0014475b;
          }
          puVar29 = (ulong *)(pBVar8 + uVar52);
          if (*puVar29 == *puVar50) {
            puVar47 = puVar50 + 1;
            puVar33 = puVar29 + 1;
            puVar46 = puVar47;
            if (puVar47 < puVar1) {
              if (*puVar33 == *puVar47) {
                lVar32 = 0;
                do {
                  puVar33 = (ulong *)((long)puVar50 + lVar32 + 0x10);
                  if (puVar1 <= puVar33) {
                    puVar33 = (ulong *)(pBVar8 + lVar32 + uVar52 + 0x10);
                    puVar46 = (ulong *)((long)puVar50 + lVar32 + 0x10);
                    goto LAB_001440a1;
                  }
                  lVar34 = lVar32 + uVar52 + 0x10;
                  uVar36 = *puVar33;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar8 + lVar34) == uVar36);
                uVar36 = uVar36 ^ *(ulong *)(pBVar8 + lVar34);
                uVar38 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar36 = (uVar38 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar38 = *puVar47 ^ *puVar33;
                uVar36 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                  }
                }
                uVar36 = uVar36 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001440a1:
              if ((puVar46 < puVar2) && ((int)*puVar33 == (int)*puVar46)) {
                puVar46 = (ulong *)((long)puVar46 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar46 < puVar3) && ((short)*puVar33 == (short)*puVar46)) {
                puVar46 = (ulong *)((long)puVar46 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar46 < iEnd) {
                puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar46));
              }
              uVar36 = (long)puVar46 - (long)puVar47;
            }
            lVar32 = uVar36 + 8;
            uVar43 = iVar49 - (int)puVar29;
            if (puVar50 <= src) goto LAB_001442dc;
            piVar24 = (int *)(pBVar8 + (uVar52 - 1));
            puVar51 = (ulong *)((long)puVar50 + -1);
            do {
              if ((char)*puVar51 != (char)*piVar24) goto LAB_001442d1;
              lVar32 = lVar32 + 1;
              puVar50 = (ulong *)((long)puVar51 + -1);
            } while ((iStart < piVar24) &&
                    (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar51,
                    puVar51 = puVar50, bVar15));
            goto LAB_0014422d;
          }
LAB_00143cb2:
          if (uVar39 <= uVar16) {
            uVar39 = pUVar14[uVar42 >> (0x20U - cVar21 & 0x1f)];
            if ((uVar39 <= uVar7) || (*(int *)(pBVar10 + uVar39) != (int)*puVar50))
            goto LAB_00143dce;
            piVar24 = (int *)(pBVar10 + uVar39);
            uVar39 = uVar39 + uVar44;
LAB_00143d0a:
            uVar52 = *(ulong *)((long)puVar50 + 1);
            uVar38 = uVar52 * -0x30e44323485a9b9d >> (bVar25 & 0x3f);
            puVar51 = (ulong *)((long)puVar50 + 1);
            uVar40 = pUVar11[uVar38];
            uVar36 = (ulong)uVar40;
            pUVar11[uVar38] = UVar27;
            if (uVar16 < uVar40) {
              puVar29 = (ulong *)(pBVar8 + uVar36);
              if (*puVar29 == uVar52) {
                puVar47 = (ulong *)((long)puVar50 + 9);
                puVar33 = puVar29 + 1;
                puVar46 = puVar47;
                if (puVar47 < puVar1) {
                  if (*puVar33 == *puVar47) {
                    lVar32 = 0;
                    do {
                      puVar33 = (ulong *)((long)puVar50 + lVar32 + 0x11);
                      if (puVar1 <= puVar33) {
                        puVar33 = (ulong *)(pBVar8 + lVar32 + uVar36 + 0x10);
                        puVar46 = (ulong *)((long)puVar50 + lVar32 + 0x11);
                        goto LAB_00144243;
                      }
                      lVar34 = lVar32 + uVar36 + 0x10;
                      uVar52 = *puVar33;
                      lVar32 = lVar32 + 8;
                    } while (*(ulong *)(pBVar8 + lVar34) == uVar52);
                    uVar52 = uVar52 ^ *(ulong *)(pBVar8 + lVar34);
                    uVar38 = 0;
                    if (uVar52 != 0) {
                      for (; (uVar52 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar52 = (uVar38 >> 3 & 0x1fffffff) + lVar32;
                  }
                  else {
                    uVar38 = *puVar47 ^ *puVar33;
                    uVar52 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                      }
                    }
                    uVar52 = uVar52 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00144243:
                  if ((puVar46 < puVar2) && ((int)*puVar33 == (int)*puVar46)) {
                    puVar46 = (ulong *)((long)puVar46 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar46 < puVar3) && ((short)*puVar33 == (short)*puVar46)) {
                    puVar46 = (ulong *)((long)puVar46 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar46 < iEnd) {
                    puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar46));
                  }
                  uVar52 = (long)puVar46 - (long)puVar47;
                }
                lVar32 = uVar52 + 8;
                uVar43 = (int)puVar51 - (int)puVar29;
                if (src < puVar51) {
                  piVar24 = (int *)(pBVar8 + (uVar36 - 1));
                  do {
                    if ((char)*puVar50 != (char)*piVar24) goto LAB_0014422d;
                    lVar32 = lVar32 + 1;
                    puVar51 = (ulong *)((long)puVar50 + -1);
                  } while ((iStart < piVar24) &&
                          (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar50,
                          puVar50 = puVar51, bVar15));
LAB_001442d1:
                  puVar51 = (ulong *)((long)puVar51 + 1);
                }
              }
              else {
LAB_00143ef5:
                puVar51 = (ulong *)((long)puVar50 + 4);
                puVar29 = (ulong *)(piVar24 + 1);
                if (uVar39 < uVar16) {
                  sVar23 = ZSTD_count_2segments
                                     ((BYTE *)puVar51,(BYTE *)puVar29,(BYTE *)iEnd,(BYTE *)mEnd,
                                      (BYTE *)iStart);
                  lVar32 = sVar23 + 4;
                  uVar43 = UVar48 - uVar39;
                  puVar51 = puVar50;
                  if ((piVar28 < piVar24) && (src < puVar50)) {
                    puVar51 = (ulong *)((long)puVar50 + -1);
                    do {
                      piVar24 = (int *)((long)piVar24 + -1);
                      if ((char)*puVar51 != *(char *)piVar24) goto LAB_00143eea;
                      lVar32 = lVar32 + 1;
                      puVar50 = (ulong *)((long)puVar51 + -1);
                    } while ((piVar28 < piVar24) &&
                            (bVar15 = src < puVar51, puVar51 = puVar50, bVar15));
LAB_0014422d:
                    puVar51 = (ulong *)((long)puVar50 + 1);
                  }
                }
                else {
                  puVar47 = puVar51;
                  if (puVar51 < puVar1) {
                    if (*puVar29 == *puVar51) {
                      lVar32 = 0;
                      do {
                        puVar29 = (ulong *)((long)puVar50 + lVar32 + 0xc);
                        if (puVar1 <= puVar29) {
                          puVar29 = (ulong *)((long)piVar24 + lVar32 + 0xc);
                          puVar47 = (ulong *)((long)puVar50 + lVar32 + 0xc);
                          goto LAB_0014418f;
                        }
                        uVar52 = *(ulong *)((long)piVar24 + lVar32 + 0xc);
                        uVar36 = *puVar29;
                        lVar32 = lVar32 + 8;
                      } while (uVar52 == uVar36);
                      uVar36 = uVar36 ^ uVar52;
                      uVar52 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                        }
                      }
                      uVar52 = (uVar52 >> 3 & 0x1fffffff) + lVar32;
                    }
                    else {
                      uVar36 = *puVar51 ^ *puVar29;
                      uVar52 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                        }
                      }
                      uVar52 = uVar52 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_0014418f:
                    if ((puVar47 < puVar2) && ((int)*puVar29 == (int)*puVar47)) {
                      puVar47 = (ulong *)((long)puVar47 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar47 < puVar3) && ((short)*puVar29 == (short)*puVar47)) {
                      puVar47 = (ulong *)((long)puVar47 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar47 < iEnd) {
                      puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar47))
                      ;
                    }
                    uVar52 = (long)puVar47 - (long)puVar51;
                  }
                  lVar32 = uVar52 + 4;
                  uVar43 = iVar49 - (int)piVar24;
                  puVar51 = puVar50;
                  if ((iStart < piVar24) && (src < puVar50)) {
                    puVar51 = (ulong *)((long)puVar50 + -1);
                    do {
                      piVar24 = (int *)((long)piVar24 + -1);
                      if ((char)*puVar51 != *(char *)piVar24) goto LAB_00143eea;
                      lVar32 = lVar32 + 1;
                      puVar50 = (ulong *)((long)puVar51 + -1);
                    } while ((iStart < piVar24) &&
                            (bVar15 = src < puVar51, puVar51 = puVar50, bVar15));
                    goto LAB_0014422d;
                  }
                }
              }
            }
            else {
              uVar40 = pUVar13[uVar52 * -0x30e44323485a9b9d >> (0x40U - cVar20 & 0x3f)];
              puVar29 = (ulong *)(pBVar10 + uVar40);
              if (mEnd <= puVar29) goto LAB_001447d7;
              if ((uVar40 <= uVar7) || (*puVar29 != uVar52)) goto LAB_00143ef5;
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar50 + 9),(BYTE *)(puVar29 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              lVar32 = sVar23 + 8;
              uVar43 = UVar27 - (uVar44 + uVar40);
              if (src < puVar51) {
                piVar24 = (int *)(pBVar10 + ((ulong)uVar40 - 1));
                do {
                  if ((char)*puVar50 != (char)*piVar24) goto LAB_0014422d;
                  lVar32 = lVar32 + 1;
                  puVar51 = (ulong *)((long)puVar50 + -1);
                } while ((piVar28 < piVar24) &&
                        (piVar24 = (int *)((long)piVar24 + -1), bVar15 = src < puVar50,
                        puVar50 = puVar51, bVar15));
LAB_00143eea:
                puVar51 = (ulong *)((long)puVar51 + 1);
              }
            }
LAB_001442dc:
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar52 = (long)puVar51 - (long)src;
                puVar50 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar50 + uVar52) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (puVar51 <= iEnd) {
                    if (puVar22 < puVar51) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar50,(BYTE *)src,(BYTE *)puVar51,(BYTE *)puVar22);
LAB_00144345:
                      seqStore->lit = seqStore->lit + uVar52;
                      if (0xffff < uVar52) {
                        if (seqStore->longLengthID != 0) goto LAB_0014477a;
                        seqStore->longLengthID = 1;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar36 = *(ulong *)((long)src + 8);
                      *puVar50 = *src;
                      puVar50[1] = uVar36;
                      pBVar35 = seqStore->lit;
                      if (0x10 < uVar52) {
                        lVar34 = (long)(pBVar35 + 0x10) - ((long)src + 0x10);
                        if (lVar34 < 8) {
                          if (-0x10 < lVar34) goto LAB_00144799;
                        }
                        else if (0xffffffffffffffe0 < lVar34 - 0x10U) goto LAB_001447b8;
                        uVar36 = *(ulong *)((long)src + 0x18);
                        *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
                        *(ulong *)(pBVar35 + 0x18) = uVar36;
                        if (0x20 < (long)uVar52) {
                          lVar34 = 0;
                          do {
                            puVar6 = (undefined8 *)((long)src + lVar34 + 0x20);
                            uVar17 = puVar6[1];
                            pBVar4 = pBVar35 + lVar34 + 0x20;
                            *(undefined8 *)pBVar4 = *puVar6;
                            *(undefined8 *)(pBVar4 + 8) = uVar17;
                            puVar6 = (undefined8 *)((long)src + lVar34 + 0x30);
                            uVar17 = puVar6[1];
                            *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                            *(undefined8 *)(pBVar4 + 0x18) = uVar17;
                            lVar34 = lVar34 + 0x20;
                          } while (pBVar4 + 0x20 < pBVar35 + uVar52);
                        }
                        goto LAB_00144345;
                      }
                      seqStore->lit = pBVar35 + uVar52;
                    }
                    uVar36 = lVar32 - 3;
                    psVar53 = seqStore->sequences;
                    psVar53->litLength = (U16)uVar52;
                    psVar53->offset = uVar43 + 3;
                    uVar30 = local_13c;
                    if (uVar36 < 0x10000) goto LAB_0014440d;
                    if (seqStore->longLengthID == 0) goto LAB_001443ec;
                    goto LAB_0014473c;
                  }
                  goto LAB_001446df;
                }
                goto LAB_001446c0;
              }
              goto LAB_001446fe;
            }
            goto LAB_0014471d;
          }
          piVar24 = (int *)(pBVar8 + uVar39);
          if (*piVar24 == (int)*puVar50) goto LAB_00143d0a;
LAB_00143dce:
          puVar50 = (ulong *)((long)puVar50 + ((long)puVar50 - (long)src >> 8) + 1);
        }
        local_13c = uVar43;
      } while (puVar50 < puVar5);
    }
  }
  *rep = uVar43;
  rep[1] = uVar30;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}